

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O2

SVGPatternAttributes * __thiscall
lunasvg::SVGPatternElement::collectPatternAttributes
          (SVGPatternAttributes *__return_storage_ptr__,SVGPatternElement *this)

{
  bool bVar1;
  char cVar2;
  SVGPatternElement *pSVar3;
  size_type sVar4;
  SVGPatternElement *pSVar5;
  _List_node_base *p_Var6;
  SVGPatternElement *pSVar7;
  SVGPatternElement *pSVar8;
  SVGNodeList *pSVar9;
  SVGPatternElement *current;
  SVGPatternElement *local_a0;
  SVGPatternElement *local_98;
  SVGPatternElement *local_90;
  SVGPatternElement *local_88;
  SVGPatternElement *local_80;
  SVGPatternElement *local_78;
  SVGPatternElement *local_70;
  SVGPatternElement *local_68;
  set<const_lunasvg::SVGPatternElement_*,_std::less<const_lunasvg::SVGPatternElement_*>,_std::allocator<const_lunasvg::SVGPatternElement_*>_>
  processedPatterns;
  
  __return_storage_ptr__->m_preserveAspectRatio = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_patternContentElement = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_patternContentUnits = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_viewBox = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_patternTransform = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_patternUnits = (SVGPatternElement *)0x0;
  processedPatterns._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &processedPatterns._M_t._M_impl.super__Rb_tree_header._M_header;
  processedPatterns._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  processedPatterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  processedPatterns._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->m_width = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_height = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_x = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_y = (SVGPatternElement *)0x0;
  local_a0 = (SVGPatternElement *)0x0;
  local_98 = (SVGPatternElement *)0x0;
  local_90 = (SVGPatternElement *)0x0;
  local_88 = (SVGPatternElement *)0x0;
  local_80 = (SVGPatternElement *)0x0;
  local_78 = (SVGPatternElement *)0x0;
  local_70 = (SVGPatternElement *)0x0;
  pSVar8 = (SVGPatternElement *)0x0;
  pSVar7 = (SVGPatternElement *)0x0;
  pSVar5 = (SVGPatternElement *)0x0;
  current = this;
  local_68 = this;
  processedPatterns._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       processedPatterns._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (pSVar5 == (SVGPatternElement *)0x0) {
      bVar1 = SVGElement::hasAttribute((SVGElement *)current,X);
      if (bVar1) {
        __return_storage_ptr__->m_x = current;
        pSVar5 = current;
      }
      else {
        pSVar5 = (SVGPatternElement *)0x0;
      }
    }
    if (pSVar7 == (SVGPatternElement *)0x0) {
      bVar1 = SVGElement::hasAttribute((SVGElement *)current,Y);
      if (bVar1) {
        __return_storage_ptr__->m_y = current;
        pSVar7 = current;
      }
      else {
        pSVar7 = (SVGPatternElement *)0x0;
      }
    }
    if (pSVar8 == (SVGPatternElement *)0x0) {
      bVar1 = SVGElement::hasAttribute((SVGElement *)current,Width);
      if (bVar1) {
        __return_storage_ptr__->m_width = current;
        pSVar8 = current;
      }
      else {
        pSVar8 = (SVGPatternElement *)0x0;
      }
    }
    if (local_70 == (SVGPatternElement *)0x0) {
      bVar1 = SVGElement::hasAttribute((SVGElement *)current,Height);
      if (bVar1) {
        __return_storage_ptr__->m_height = current;
        local_70 = current;
      }
      else {
        local_70 = (SVGPatternElement *)0x0;
      }
    }
    if (local_78 == (SVGPatternElement *)0x0) {
      bVar1 = SVGElement::hasAttribute((SVGElement *)current,PatternTransform);
      if (bVar1) {
        __return_storage_ptr__->m_patternTransform = current;
        local_78 = current;
      }
      else {
        local_78 = (SVGPatternElement *)0x0;
      }
    }
    if (local_80 == (SVGPatternElement *)0x0) {
      bVar1 = SVGElement::hasAttribute((SVGElement *)current,PatternUnits);
      if (bVar1) {
        __return_storage_ptr__->m_patternUnits = current;
        local_80 = current;
      }
      else {
        local_80 = (SVGPatternElement *)0x0;
      }
    }
    if (local_88 == (SVGPatternElement *)0x0) {
      bVar1 = SVGElement::hasAttribute((SVGElement *)current,PatternContentUnits);
      if (bVar1) {
        __return_storage_ptr__->m_patternContentUnits = current;
        local_88 = current;
      }
      else {
        local_88 = (SVGPatternElement *)0x0;
      }
    }
    if (local_90 == (SVGPatternElement *)0x0) {
      bVar1 = SVGElement::hasAttribute((SVGElement *)current,ViewBox);
      if (bVar1) {
        __return_storage_ptr__->m_viewBox = current;
        local_90 = current;
      }
      else {
        local_90 = (SVGPatternElement *)0x0;
      }
    }
    if (local_98 == (SVGPatternElement *)0x0) {
      bVar1 = SVGElement::hasAttribute((SVGElement *)current,PreserveAspectRatio);
      if (bVar1) {
        __return_storage_ptr__->m_preserveAspectRatio = current;
        local_98 = current;
      }
      else {
        local_98 = (SVGPatternElement *)0x0;
      }
    }
    if (local_a0 == (SVGPatternElement *)0x0) {
      pSVar9 = &(current->super_SVGPaintElement).super_SVGElement.m_children;
      p_Var6 = (_List_node_base *)pSVar9;
      do {
        p_Var6 = (((_List_base<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
                    *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var6 == (_List_node_base *)pSVar9) {
          local_a0 = (SVGPatternElement *)0x0;
          goto LAB_00117040;
        }
        cVar2 = (**(code **)(*(long *)p_Var6[1]._M_next + 0x18))();
      } while (cVar2 == '\0');
      __return_storage_ptr__->m_patternContentElement = current;
      local_a0 = current;
    }
LAB_00117040:
    pSVar3 = (SVGPatternElement *)
             SVGURIReference::getTargetElement
                       (&current->super_SVGURIReference,
                        (local_68->super_SVGPaintElement).super_SVGElement.super_SVGNode.m_document)
    ;
    if ((pSVar3 == (SVGPatternElement *)0x0) ||
       ((pSVar3->super_SVGPaintElement).super_SVGElement.m_id != Pattern)) break;
    std::
    _Rb_tree<lunasvg::SVGPatternElement_const*,lunasvg::SVGPatternElement_const*,std::_Identity<lunasvg::SVGPatternElement_const*>,std::less<lunasvg::SVGPatternElement_const*>,std::allocator<lunasvg::SVGPatternElement_const*>>
    ::_M_insert_unique<lunasvg::SVGPatternElement_const*const&>
              ((_Rb_tree<lunasvg::SVGPatternElement_const*,lunasvg::SVGPatternElement_const*,std::_Identity<lunasvg::SVGPatternElement_const*>,std::less<lunasvg::SVGPatternElement_const*>,std::allocator<lunasvg::SVGPatternElement_const*>>
                *)&processedPatterns,&current);
    current = pSVar3;
    sVar4 = std::
            set<const_lunasvg::SVGPatternElement_*,_std::less<const_lunasvg::SVGPatternElement_*>,_std::allocator<const_lunasvg::SVGPatternElement_*>_>
            ::count(&processedPatterns,&current);
  } while (sVar4 == 0);
  SVGPatternAttributes::setDefaultValues(__return_storage_ptr__,local_68);
  std::
  _Rb_tree<const_lunasvg::SVGPatternElement_*,_const_lunasvg::SVGPatternElement_*,_std::_Identity<const_lunasvg::SVGPatternElement_*>,_std::less<const_lunasvg::SVGPatternElement_*>,_std::allocator<const_lunasvg::SVGPatternElement_*>_>
  ::~_Rb_tree(&processedPatterns._M_t);
  return __return_storage_ptr__;
}

Assistant:

SVGPatternAttributes SVGPatternElement::collectPatternAttributes() const
{
    SVGPatternAttributes attributes;
    std::set<const SVGPatternElement*> processedPatterns;
    const SVGPatternElement* current = this;
    while(true) {
        if(!attributes.hasX() && current->hasAttribute(PropertyID::X))
            attributes.setX(current);
        if(!attributes.hasY() && current->hasAttribute(PropertyID::Y))
            attributes.setY(current);
        if(!attributes.hasWidth() && current->hasAttribute(PropertyID::Width))
            attributes.setWidth(current);
        if(!attributes.hasHeight() && current->hasAttribute(PropertyID::Height))
            attributes.setHeight(current);
        if(!attributes.hasPatternTransform() && current->hasAttribute(PropertyID::PatternTransform))
            attributes.setPatternTransform(current);
        if(!attributes.hasPatternUnits() && current->hasAttribute(PropertyID::PatternUnits))
            attributes.setPatternUnits(current);
        if(!attributes.hasPatternContentUnits() && current->hasAttribute(PropertyID::PatternContentUnits))
            attributes.setPatternContentUnits(current);
        if(!attributes.hasViewBox() && current->hasAttribute(PropertyID::ViewBox))
            attributes.setViewBox(current);
        if(!attributes.hasPreserveAspectRatio() && current->hasAttribute(PropertyID::PreserveAspectRatio))
            attributes.setPreserveAspectRatio(current);
        if(!attributes.hasPatternContentElement()) {
            for(const auto& child : current->children()) {
                if(child->isElement()) {
                    attributes.setPatternContentElement(current);
                    break;
                }
            }
        }

        auto targetElement = current->getTargetElement(document());
        if(!targetElement || targetElement->id() != ElementID::Pattern)
            break;
        processedPatterns.insert(current);
        current = static_cast<const SVGPatternElement*>(targetElement);
        if(processedPatterns.count(current) > 0) {
            break;
        }
    }

    attributes.setDefaultValues(this);
    return attributes;
}